

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

BusyIndicator * __thiscall BusyIndicator::writeXml_abi_cxx11_(BusyIndicator *this,int indent)

{
  ostream *poVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  Widget *this_00;
  allocator local_219;
  string local_218 [32];
  Util local_1f8 [48];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  Widget *pWStack_18;
  int indent_local;
  BusyIndicator *this_local;
  
  this_00 = (Widget *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  pWStack_18 = this_00;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar1 = std::operator<<(local_198,(string *)local_1c8);
  std::operator<<(poVar1,"<BusyIndicator");
  std::__cxx11::string::~string((string *)local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"animating",&local_219);
  Util::writeXmlAttribute<bool>
            (local_1f8,(stringstream *)local_1a8,(string *)local_218,
             (bool)(*(byte *)&this_00[1]._vptr_Widget & 1));
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  Widget::writeXmlAttributes(this_00,(stringstream *)local_1a8);
  poVar1 = std::operator<<(local_198," />");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string BusyIndicator::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<BusyIndicator";

	Util::writeXmlAttribute(str, "animating", animating);
	writeXmlAttributes(str);
	str << " />" << std::endl;
	return str.str();
}